

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void splashscreen_note(game_event_type type,game_event_data *data,void *user)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *s;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  if ((data->message).type == L'\x01') {
    prt(data->string,splashscreen_note::y,L'\0');
    pause_line((term_conflict1 *)Term);
    splashscreen_note::y = splashscreen_note::y + L'\x01';
    if (L'\x17' < splashscreen_note::y) {
      splashscreen_note::y = L'\x02';
    }
  }
  else {
    __s = format("[%s]",data->string);
    Term_erase(L'\0',(Term->hgt + -0x17) / 5 + L'\x17',L'ÿ');
    iVar1 = Term->wid;
    sVar2 = strlen(__s);
    Term_putstr((wchar_t)((long)iVar1 - sVar2 >> 1),(Term->hgt + -0x17) / 5 + L'\x17',L'\xffffffff',
                L'\x01',__s);
  }
  Term_fresh();
  return;
}

Assistant:

static void splashscreen_note(game_event_type type, game_event_data *data,
							  void *user)
{
	if (data->message.type == MSG_BIRTH) {
		static int y = 2;

		/* Draw the message */
		prt(data->message.msg, y, 0);
		pause_line(Term);

		/* Advance one line (wrap if needed) */
		if (++y >= 24) y = 2;
	} else {
		char *s = format("[%s]", data->message.msg);
		Term_erase(0, (Term->hgt - 23) / 5 + 23, 255);
		Term_putstr((Term->wid - strlen(s)) / 2, (Term->hgt - 23) / 5 + 23, -1,
					COLOUR_WHITE, s);
	}

	Term_fresh();
}